

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TweakableParser.cpp
# Opt level: O2

Pair<Corrade::Utility::TweakableState,_long_long>
Corrade::Utility::TweakableParser<long_long>::parse(StringView value)

{
  StringView value_00;
  longlong lVar1;
  Debug *pDVar2;
  char *pcVar3;
  undefined8 extraout_RAX;
  undefined8 uVar4;
  size_t in_RDX;
  char *in_RSI;
  anon_unknown_14 *in_RDI;
  Pair<const_char_*,_int> PVar5;
  BasicStringView<const_char> value_01;
  Pair<Corrade::Utility::TweakableState,_long_long> PVar6;
  StringView value_02;
  StringView value_03;
  char *end;
  BasicStringView<const_char> local_60;
  Warning local_50;
  anon_unknown_14 *local_28;
  
  value_02._sizePlusFlags = in_RDX;
  value_02._data = in_RSI;
  local_60._data = (char *)in_RDI;
  local_60._sizePlusFlags = (size_t)in_RSI;
  PVar5 = anon_unknown_14::integerBase(in_RDI,value_02);
  lVar1 = strtoll(PVar5._first,(char **)&local_28,PVar5._second);
  if (local_28 == in_RDI) {
    Warning::Warning(&local_50,(Flags)0x0);
    pDVar2 = Debug::operator<<(&local_50.super_Debug,"Utility::TweakableParser:");
    value_03._sizePlusFlags = (size_t)in_RSI;
    value_03._data = (char *)in_RDI;
    pDVar2 = Debug::operator<<(pDVar2,value_03);
    Debug::operator<<(pDVar2,"is not an integer literal");
  }
  else if (((ulong)in_RSI & 0x3fffffffffffffff) < 2) {
LAB_0015439d:
    Warning::Warning(&local_50,(Flags)0x0);
    pDVar2 = Debug::operator<<(&local_50.super_Debug,"Utility::TweakableParser:");
    value_00._sizePlusFlags = local_60._sizePlusFlags;
    value_00._data = local_60._data;
    pDVar2 = Debug::operator<<(pDVar2,value_00);
    Debug::operator<<(pDVar2,"has an unexpected suffix, expected ll");
  }
  else {
    pcVar3 = Containers::BasicStringView<const_char>::operator[]
                       (&local_60,((ulong)in_RSI & 0x3fffffffffffffff) - 1);
    if (*pcVar3 != 'l') {
      pcVar3 = Containers::BasicStringView<const_char>::operator[]
                         (&local_60,(local_60._sizePlusFlags & 0x3fffffffffffffff) - 1);
      if (*pcVar3 != 'L') {
        pcVar3 = Containers::BasicStringView<const_char>::operator[]
                           (&local_60,(local_60._sizePlusFlags & 0x3fffffffffffffff) - 2);
        if (*pcVar3 != 'l') {
          pcVar3 = Containers::BasicStringView<const_char>::operator[]
                             (&local_60,(local_60._sizePlusFlags & 0x3fffffffffffffff) - 2);
          if (*pcVar3 != 'L') goto LAB_0015439d;
        }
      }
    }
    if (local_28 ==
        (anon_unknown_14 *)(local_60._data + ((local_60._sizePlusFlags & 0x3fffffffffffffff) - 2)))
    {
      uVar4 = CONCAT71((int7)((ulong)(local_60._data +
                                     ((local_60._sizePlusFlags & 0x3fffffffffffffff) - 2)) >> 8),1);
      goto LAB_001544f6;
    }
    Warning::Warning(&local_50,(Flags)0x0);
    pDVar2 = Debug::operator<<(&local_50.super_Debug,
                               "Utility::TweakableParser: unexpected characters");
    value_01 = Containers::BasicStringView<const_char>::suffix(&local_60,(char *)local_28);
    pDVar2 = Debug::operator<<(pDVar2,value_01);
    Debug::operator<<(pDVar2,"after an integer literal");
  }
  Warning::~Warning(&local_50);
  uVar4 = CONCAT71((int7)((ulong)extraout_RAX >> 8),2);
  lVar1 = 0;
LAB_001544f6:
  PVar6._second = lVar1;
  PVar6._0_8_ = uVar4;
  return PVar6;
}

Assistant:

Containers::Pair<TweakableState, long long> TweakableParser<long long>::parse(Containers::StringView value) {
    const Containers::Pair<const char*, int> valueBase = integerBase(value);
    char* end;
    const long long result = std::strtoll(valueBase.first(), &end, valueBase.second());

    if(end == value.begin()) {
        Warning{} << "Utility::TweakableParser:" << value << "is not an integer literal";
        return {TweakableState::Recompile, {}};
    }

    if(value.size() < 2 ||
      (value[value.size() - 1] != 'l' && value[value.size() - 1] != 'L' &&
       value[value.size() - 2] != 'l' && value[value.size() - 2] != 'L'))
    {
        Warning{} << "Utility::TweakableParser:" << value << "has an unexpected suffix, expected ll";
        return {TweakableState::Recompile, {}};
    }

    if(end != value.end() - 2) {
        Warning{} << "Utility::TweakableParser: unexpected characters" << value.suffix(end) << "after an integer literal";
        return {TweakableState::Recompile, {}};
    }

    return {TweakableState::Success, result};
}